

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingOpenCV.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Result *barcode;
  iterator __end3;
  iterator __begin3;
  Barcodes *__range3;
  Barcodes barcodes;
  VideoCapture cap;
  Mat image;
  Mat *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar4;
  vector<ZXing::Result,_std::allocator<ZXing::Result>_> *in_stack_fffffffffffffdd0;
  Result *in_stack_fffffffffffffdd8;
  Size in_stack_fffffffffffffde0;
  Mat *in_stack_fffffffffffffde8;
  allocator<char> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
  local_108;
  undefined1 *local_100;
  undefined1 local_e8 [24];
  VideoCapture local_d0 [48];
  Mat local_a0 [40];
  Barcode *in_stack_ffffffffffffff88;
  Mat *in_stack_ffffffffffffff90;
  allocator<char> local_29;
  string local_28 [36];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  cv::namedWindow(local_28,1);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  cv::Mat::Mat(local_a0);
  cv::VideoCapture::VideoCapture(local_d0,0,0);
  bVar1 = cv::VideoCapture::isOpened();
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdc4);
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"cannot open camera");
  }
  else {
    while (iVar3 = cv::waitKey(0x19), iVar3 != 0x1b) {
      cv::VideoCapture::operator>>(local_d0,local_a0);
      ZXing::ReaderOptions::ReaderOptions((ReaderOptions *)0x1065f6);
      ReadBarcodes(in_stack_fffffffffffffde8,(ReaderOptions *)in_stack_fffffffffffffde0);
      local_100 = local_e8;
      local_108._M_current =
           (Result *)
           std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::begin
                     ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                      in_stack_fffffffffffffdb8);
      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::end
                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)in_stack_fffffffffffffdb8)
      ;
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                                 *)CONCAT44(uVar4,iVar3),
                                (__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                                 *)in_stack_fffffffffffffdb8), bVar2) {
        __gnu_cxx::
        __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
        ::operator*(&local_108);
        ZXing::Result::Result((Result *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        DrawBarcode(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        ZXing::Result::~Result((Result *)CONCAT44(uVar4,iVar3));
        __gnu_cxx::
        __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
        ::operator++(&local_108);
      }
      in_stack_fffffffffffffdb8 = (Mat *)&stack0xfffffffffffffdef;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      cv::_InputArray::_InputArray((_InputArray *)CONCAT44(uVar4,iVar3),in_stack_fffffffffffffdb8);
      cv::imshow((string *)&stack0xfffffffffffffdf0,(_InputArray *)&stack0xfffffffffffffdd0);
      cv::_InputArray::~_InputArray((_InputArray *)&stack0xfffffffffffffdd0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector(in_stack_fffffffffffffdd0)
      ;
    }
  }
  local_4 = 0;
  cv::VideoCapture::~VideoCapture(local_d0);
  cv::Mat::~Mat(local_a0);
  return local_4;
}

Assistant:

int main()
{
	namedWindow("Display window");

	Mat image;
	VideoCapture cap(0);

	if (!cap.isOpened())
		std::cout << "cannot open camera";
	else
		while (waitKey(25) != 27) {
			cap >> image;
			auto barcodes = ReadBarcodes(image);
			for (auto& barcode : barcodes)
				DrawBarcode(image, barcode);
			imshow("Display window", image);
		}

	return 0;
}